

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O1

Json __thiscall Entity::to_json_abi_cxx11_(Entity *this,World *world)

{
  Entity *entity;
  _Base_ptr p_Var1;
  byte bVar2;
  mapped_type *ppEVar3;
  reference pvVar4;
  long in_RDX;
  json_value extraout_RDX;
  json_value extraout_RDX_00;
  json_value extraout_RDX_01;
  json_value jVar5;
  EntityMaskFlag *mask;
  _Base_ptr p_Var6;
  Json JVar7;
  key_type_conflict local_181;
  string_t local_180;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_160;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_150;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_140;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_130;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_120;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_110;
  Flag local_100;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f0;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e0;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d0;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c0;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b0;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a0;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_90;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  
  (this->_attrs).type_id = '\0';
  (this->_attrs).palette = '\0';
  (this->_attrs).speed = '\0';
  (this->_attrs).fightable = false;
  (this->_attrs).liftable = false;
  (this->_attrs).can_pass_through = false;
  (this->_attrs).appear_after_player_moved_away = false;
  (this->_attrs).gravity_immune = false;
  (this->_attrs).talkable = false;
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)this,true);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)this,true);
  local_181 = *(key_type_conflict *)&(world->_items)._M_t._M_impl;
  ppEVar3 = std::
            map<unsigned_char,_EntityType_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_EntityType_*>_>_>
            ::at((map<unsigned_char,_EntityType_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_EntityType_*>_>_>
                  *)(in_RDX + 0x48),&local_181);
  (*(*ppEVar3)->_vptr_EntityType[1])(&local_180);
  local_160.m_type = null;
  local_160.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
  construct<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_160,&local_180);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_160,true);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)this,"entityType");
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(pvVar4,&local_160);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  Position::to_json_abi_cxx11_((Position *)&local_40);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)this,"position");
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(pvVar4,&local_40);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_40);
  local_50.m_type = null;
  local_50.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)6>::
  construct<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_50,(ulong)(byte)(world->_items)._M_t._M_impl.field_0x7);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_50,true);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)this,"orientation");
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(pvVar4,&local_50);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_50);
  local_60.m_type = null;
  local_60.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)6>::
  construct<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_60,
             (ulong)(byte)(char)(world->_items)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_color);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_60,true);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)this,"palette");
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(pvVar4,&local_60);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_60);
  local_70.m_type = null;
  local_70.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)6>::
  construct<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_70,
             (ulong)*(byte *)((long)&(world->_items)._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_color + 1));
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_70,true);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)this,"speed");
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(pvVar4,&local_70);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_70);
  local_80.m_type = null;
  local_80.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)4>::
  construct<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_80,
             *(boolean_t *)
              ((long)&(world->_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color + 2));
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_80,true);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)this,"fightable");
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(pvVar4,&local_80);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_80);
  local_90.m_type = null;
  local_90.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)4>::
  construct<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_90,
             *(boolean_t *)
              ((long)&(world->_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color + 3));
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_90,true);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)this,"liftable");
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(pvVar4,&local_90);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_90);
  local_a0.m_type = null;
  local_a0.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)4>::
  construct<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_a0,
             (boolean_t)(world->_items)._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_a0,true);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)this,"canPassThrough");
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(pvVar4,&local_a0);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_a0);
  local_b0.m_type = null;
  local_b0.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)4>::
  construct<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_b0,
             (boolean_t)(world->_items)._M_t._M_impl.super__Rb_tree_header._M_header.field_0x5);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_b0,true);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)this,"appearAfterPlayerMovedAway");
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(pvVar4,&local_b0);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_b0);
  local_c0.m_type = null;
  local_c0.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)4>::
  construct<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_c0,
             (boolean_t)(world->_items)._M_t._M_impl.super__Rb_tree_header._M_header.field_0x6);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_c0,true);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)this,"gravityImmune");
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(pvVar4,&local_c0);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_c0);
  local_d0.m_type = null;
  local_d0.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)4>::
  construct<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_d0,
             (boolean_t)(world->_items)._M_t._M_impl.super__Rb_tree_header._M_header.field_0x7);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_d0,true);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)this,"talkable");
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(pvVar4,&local_d0);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_d0);
  if ((world->_items)._M_t._M_impl.super__Rb_tree_header._M_header.field_0x7 == '\x01') {
    local_e0.m_type = null;
    local_e0.m_value.object = (object_t *)0x0;
    nlohmann::detail::external_constructor<(nlohmann::detail::value_t)6>::
    construct<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (&local_e0,
               (ulong)*(byte *)&(world->_items)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_parent);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_e0,true);
    pvVar4 = nlohmann::
             basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)this,"dialogue");
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator=(pvVar4,&local_e0);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_e0);
  }
  local_f0.m_type = null;
  local_f0.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)6>::
  construct<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_f0,
             (ulong)*(ushort *)
                     ((long)&(world->_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                     + 2));
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_f0,true);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)this,"behaviorId");
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(pvVar4,&local_f0);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_f0);
  if ((*(short *)&(world->_game_strings).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage != 0xff) &&
     (*(byte *)((long)&(world->_game_strings).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) < 8)) {
    Flag::to_json_abi_cxx11_(&local_100);
    pvVar4 = nlohmann::
             basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)this,"persistenceFlag");
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator=(pvVar4,(basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_100);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&local_100);
  }
  p_Var6 = (world->_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_110.m_type = null;
  local_110.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)4>::
  construct<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_110,p_Var6 != (_Base_ptr)0x0);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_110,true);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)this,"useTilesFromOtherEntity");
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(pvVar4,&local_110);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_110);
  if (p_Var6 != (_Base_ptr)0x0) {
    entity = (Entity *)(world->_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar2 = Map::entity_id(entity->_map,entity);
    local_120.m_type = null;
    local_120.m_value.object = (object_t *)0x0;
    nlohmann::detail::external_constructor<(nlohmann::detail::value_t)6>::
    construct<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (&local_120,(ulong)bVar2);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_120,true);
    pvVar4 = nlohmann::
             basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)this,"entityIdToUseTilesFrom");
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator=(pvVar4,&local_120);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_120);
  }
  local_130.m_type = null;
  local_130.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)4>::
  construct<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_130,*(boolean_t *)&(world->_entity_types)._M_t._M_impl);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_130,true);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)this,"flagUnknown_2_3");
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(pvVar4,&local_130);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_130);
  local_140.m_type = null;
  local_140.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)4>::
  construct<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_140,(boolean_t)(world->_entity_types)._M_t._M_impl.field_0x1);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_140,true);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)this,"flagUnknown_2_4");
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(pvVar4,&local_140);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_140);
  jVar5 = extraout_RDX;
  if ((world->_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right !=
      (_Base_ptr)(world->_items)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&local_150,(initializer_list_t)ZEXT816(0),false,array);
    pvVar4 = nlohmann::
             basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)this,"maskFlags");
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator=(pvVar4,&local_150);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_150);
    p_Var6 = (world->_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    p_Var1 = (_Base_ptr)(world->_items)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    jVar5 = extraout_RDX_00;
    if (p_Var6 != p_Var1) {
      do {
        pvVar4 = nlohmann::
                 basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this,"maskFlags");
        (*(code *)**(undefined8 **)p_Var6)(&local_180,p_Var6);
        nlohmann::
        basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::
        emplace_back<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)pvVar4,
                   (basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&local_180);
        nlohmann::
        basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&local_180);
        p_Var6 = (_Base_ptr)&p_Var6->_M_left;
        jVar5 = extraout_RDX_01;
      } while (p_Var6 != p_Var1);
    }
  }
  JVar7.m_value.object = jVar5.object;
  JVar7._0_8_ = this;
  return JVar7;
}

Assistant:

Json Entity::to_json(const World& world) const
{
    Json json;

    json["entityType"] = world.entity_type(_attrs.type_id)->name();

    json["position"] = _attrs.position.to_json();
    json["orientation"] = _attrs.orientation;
    json["palette"] = _attrs.palette;
    json["speed"] = _attrs.speed;

    json["fightable"] = _attrs.fightable;
    json["liftable"] = _attrs.liftable;
    json["canPassThrough"] = _attrs.can_pass_through;
    json["appearAfterPlayerMovedAway"] = _attrs.appear_after_player_moved_away;
    json["gravityImmune"] = _attrs.gravity_immune;

    json["talkable"] = _attrs.talkable;
    if(_attrs.talkable)
        json["dialogue"] = _attrs.dialogue;

    json["behaviorId"] = _attrs.behavior_id;
    if(this->has_persistence_flag())
        json["persistenceFlag"] = _attrs.persistence_flag.to_json();

    bool use_tiles_from_other_entity = (_attrs.entity_to_use_tiles_from != nullptr);
    json["useTilesFromOtherEntity"] = use_tiles_from_other_entity;
    if(use_tiles_from_other_entity)
        json["entityIdToUseTilesFrom"] = _attrs.entity_to_use_tiles_from->entity_id();

    json["flagUnknown_2_3"] = _attrs.flag_unknown_2_3;
    json["flagUnknown_2_4"] = _attrs.flag_unknown_2_4;
//    json["flagUnknown_3_5"] = _attrs.flag_unknown_3_5;

    if(!_attrs.mask_flags.empty())
    {
        json["maskFlags"] = Json::array();
        for(const EntityMaskFlag& mask : _attrs.mask_flags)
            json["maskFlags"].emplace_back(mask.to_json());
    }

    return json;
}